

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::
write_int<unsigned__int128>
          (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
           *this,unsigned___int128 value,format_specs *spec)

{
  byte bVar1;
  long in_RCX;
  undefined1 auStack_58 [8];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> w;
  
  auStack_58 = *(undefined1 (*) [8])this;
  w.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)(this + 8);
  w.abs_value._12_4_ = 0;
  bVar1 = *(byte *)(in_RCX + 9) >> 4 & 7;
  if (1 < bVar1) {
    w.abs_value._8_1_ = 0x20;
    if (bVar1 == 2) {
      w.abs_value._8_1_ = 0x2b;
    }
    w.abs_value._12_4_ = 1;
  }
  w._24_8_ = spec;
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
            (*(char *)(in_RCX + 8),
             (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)
             auStack_58);
  *(undefined1 (*) [8])this = auStack_58;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }